

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool,true,false>
               (interval_t *ldata,interval_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  bool bVar3;
  int64_t *piVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  idx_t iVar16;
  int64_t *local_78;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar6 = ldata->micros;
      lVar9._0_4_ = ldata->months;
      lVar9._4_4_ = ldata->days;
      lVar13 = (lVar9 >> 0x20) + lVar6 / 86400000000;
      lVar10 = lVar13 % 0x1e;
      lVar9 = (long)(int)(undefined4)lVar9 + lVar13 / 0x1e;
      local_78 = &rdata->micros;
      iVar16 = 0;
      do {
        lVar13._0_4_ = ((interval_t *)(local_78 + -1))->months;
        lVar13._4_4_ = ((interval_t *)(local_78 + -1))->days;
        lVar11 = (lVar13 >> 0x20) + *local_78 / 86400000000;
        lVar12 = lVar11 % 0x1e;
        lVar13 = (long)(int)(undefined4)lVar13 + lVar11 / 0x1e;
        if (lVar9 < lVar13) {
LAB_00e4a2ac:
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (lVar9 <= lVar13) {
            if (lVar10 < lVar12) goto LAB_00e4a2ac;
            bVar3 = *local_78 % 86400000000 <= lVar6 % 86400000000 || lVar12 < lVar10;
          }
        }
        result_data[iVar16] = bVar3;
        iVar16 = iVar16 + 1;
        local_78 = local_78 + 2;
      } while (count != iVar16);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar15 = 0;
    do {
      uVar2 = puVar1[uVar5];
      uVar8 = uVar15 + 0x40;
      if (count <= uVar15 + 0x40) {
        uVar8 = count;
      }
      uVar14 = uVar8;
      if (uVar2 != 0) {
        uVar14 = uVar15;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar15 < uVar8) {
            lVar6 = ldata->micros;
            lVar12._0_4_ = ldata->months;
            lVar12._4_4_ = ldata->days;
            lVar9 = (lVar12 >> 0x20) + lVar6 / 86400000000;
            lVar13 = lVar9 % 0x1e;
            lVar9 = (long)(int)(undefined4)lVar12 + lVar9 / 0x1e;
            piVar4 = &rdata[uVar15].micros;
            do {
              lVar11._0_4_ = ((interval_t *)(piVar4 + -1))->months;
              lVar11._4_4_ = ((interval_t *)(piVar4 + -1))->days;
              lVar10 = (lVar11 >> 0x20) + *piVar4 / 86400000000;
              lVar12 = lVar10 % 0x1e;
              lVar10 = (long)(int)(undefined4)lVar11 + lVar10 / 0x1e;
              if (lVar9 < lVar10) {
LAB_00e4a043:
                bVar3 = false;
              }
              else {
                bVar3 = true;
                if (lVar9 <= lVar10) {
                  if (lVar13 < lVar12) goto LAB_00e4a043;
                  bVar3 = *piVar4 % 86400000000 <= lVar6 % 86400000000 || lVar12 < lVar13;
                }
              }
              result_data[uVar14] = bVar3;
              uVar14 = uVar14 + 1;
              piVar4 = piVar4 + 2;
            } while (uVar8 != uVar14);
          }
        }
        else if (uVar15 < uVar8) {
          piVar4 = &rdata[uVar15].micros;
          uVar7 = 0;
          do {
            if ((uVar2 >> (uVar7 & 0x3f) & 1) != 0) {
              lVar6._0_4_ = ldata->months;
              lVar6._4_4_ = ldata->days;
              lVar10._0_4_ = ((interval_t *)(piVar4 + -1))->months;
              lVar10._4_4_ = ((interval_t *)(piVar4 + -1))->days;
              lVar9 = (lVar10 >> 0x20) + *piVar4 / 86400000000;
              lVar12 = lVar9 % 0x1e;
              lVar10 = (long)(int)(undefined4)lVar10 + lVar9 / 0x1e;
              lVar9 = (lVar6 >> 0x20) + ldata->micros / 86400000000;
              lVar13 = lVar9 % 0x1e;
              lVar6 = (long)(int)(undefined4)lVar6 + lVar9 / 0x1e;
              if (lVar6 < lVar10) {
                bVar3 = false;
              }
              else {
                bVar3 = true;
                if (lVar6 <= lVar10) {
                  if (lVar13 < lVar12) {
                    bVar3 = false;
                  }
                  else {
                    bVar3 = *piVar4 % 86400000000 <= ldata->micros % 86400000000 || lVar12 < lVar13;
                  }
                }
              }
              result_data[uVar15] = bVar3;
            }
            uVar15 = uVar15 + 1;
            piVar4 = piVar4 + 2;
            uVar7 = uVar7 + 1;
            uVar14 = uVar15;
          } while (uVar8 != uVar15);
        }
      }
      uVar5 = uVar5 + 1;
      uVar15 = uVar14;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}